

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestCase * __thiscall testing::UnitTest::GetTestCase(UnitTest *this,int i)

{
  TestCase *pTVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    pTVar1 = internal::UnitTestImpl::GetTestCase(this->impl_,i);
    return pTVar1;
  }
  __stack_chk_fail();
}

Assistant:

const TestCase* UnitTest::GetTestCase(int i) const {
  return impl()->GetTestCase(i);
}